

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupRemapLiterals(Vec_Int_t *vLits,Gia_Man_t *p)

{
  uint Lit;
  int iVar1;
  int v;
  Gia_Obj_t *pGVar2;
  int local_2c;
  int iLitNew;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  Vec_Int_t *vLits_local;
  
  for (iLitNew = 0; iVar1 = Vec_IntSize(vLits), iLitNew < iVar1; iLitNew = iLitNew + 1) {
    iVar1 = Vec_IntEntry(vLits,iLitNew);
    if (-1 < iVar1) {
      v = Abc_Lit2Var(iVar1);
      pGVar2 = Gia_ManObj(p,v);
      if (pGVar2->Value == 0xffffffff) {
        local_2c = -1;
      }
      else {
        Lit = pGVar2->Value;
        iVar1 = Abc_LitIsCompl(iVar1);
        local_2c = Abc_LitNotCond(Lit,iVar1);
      }
      Vec_IntWriteEntry(vLits,iLitNew,local_2c);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Removes pointers to the unmarked nodes..]

  Description [Array vLits contains literals of p. At the same time, 
  each object pObj of p points to a literal of pNew. This procedure
  remaps literals in array vLits into literals of pNew.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManDupRemapLiterals( Vec_Int_t * vLits, Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, iLit, iLitNew;
    Vec_IntForEachEntry( vLits, iLit, i )
    {
        if ( iLit < 0 )
            continue;
        pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        if ( ~pObj->Value == 0 )
            iLitNew = -1;
        else
            iLitNew = Abc_LitNotCond( pObj->Value, Abc_LitIsCompl(iLit) );
        Vec_IntWriteEntry( vLits, i, iLitNew );
    }
}